

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void flatbuffers::php::PhpGenerator::InitializeExisting(StructDef *struct_def,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  
  local_20 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param int $_i offset\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param ByteBuffer $_bb\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator+(&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return ");
  std::operator+(&local_d0,&local_f0,code_ptr_local);
  std::operator+(&local_b0,&local_d0,"\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::operator+(&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," **/\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::operator+(&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public function init($_i, ByteBuffer $_bb)\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::operator+(&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::operator+(&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_170,&local_190,"$this->bb_pos = $_i;\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::operator+(&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_1b0,&local_1d0,"$this->bb = $_bb;\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator+(&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_1f0,&local_210,"return $this;\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::operator+(&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  return;
}

Assistant:

static void InitializeExisting(const StructDef &struct_def,
                                 std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += Indent + "/**\n";
    code += Indent + " * @param int $_i offset\n";
    code += Indent + " * @param ByteBuffer $_bb\n";
    code += Indent + " * @return " + struct_def.name + "\n";
    code += Indent + " **/\n";
    code += Indent + "public function init($_i, ByteBuffer $_bb)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$this->bb_pos = $_i;\n";
    code += Indent + Indent + "$this->bb = $_bb;\n";
    code += Indent + Indent + "return $this;\n";
    code += Indent + "}\n\n";
  }